

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionGeneralizationImpl.hpp
# Opt level: O1

void __thiscall
Inferences::AdditionGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
          *poly)

{
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar1;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar2;
  Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
  *this_00;
  undefined4 var_00;
  Variable key;
  Cell *pCVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  Variable v;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar7;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar8;
  uint uVar9;
  bool bVar10;
  anon_class_16_2_f84bbffd f;
  Option<Kernel::Variable> var;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> factor;
  MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> gen;
  Set<Kernel::Variable,_Lib::StlHash> didOccur;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> monom;
  undefined1 local_130 [8];
  undefined8 local_128;
  __mpz_struct _Stack_120;
  uint local_110;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *local_108;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_100;
  ulong local_f8;
  ulong local_f0;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_e8;
  ulong local_e0;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_d8;
  Set<Kernel::Variable,_Lib::StlHash> local_b8;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_90;
  RealConstantType local_80;
  uint local_60;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_58;
  RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>
  local_4c [36];
  
  local_b8._capacity = 0;
  local_b8._nonemptyCells = 0;
  local_b8._size = 0;
  local_b8._entries = (Cell *)0x0;
  ::Lib::Set<Kernel::Variable,_Lib::StlHash>::expand(&local_b8);
  local_100 = poly->_ptr;
  pMVar8 = (local_100->_summands)._stack;
  pMVar1 = (local_100->_summands)._cursor;
  lVar6 = (long)pMVar1 - (long)pMVar8;
  local_108 = poly;
  if (pMVar8 != (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0 && lVar6 != 0) {
    local_f8 = (lVar6 >> 4) * -0x5555555555555555;
    uVar4 = (ulong)(pMVar1 != pMVar8);
    do {
      Kernel::RealConstantType::RealConstantType(&local_80,&pMVar8->numeral);
      local_60 = (pMVar8->factors)._id;
      local_58 = (pMVar8->factors)._ptr;
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::tryVar
                ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)local_130);
      var_00 = local_130._4_4_;
      local_f0 = uVar4;
      if (local_130[0] == '\x01') {
        uVar5 = 2;
        if (2 < (uint)local_130._4_4_) {
          uVar5 = local_130._4_4_;
        }
        uVar4 = (ulong)uVar5 % (local_b8._0_8_ & 0xffffffff);
        uVar9 = local_b8._entries[uVar4].code;
        bVar10 = uVar9 != 0;
        if (bVar10) {
          pCVar3 = local_b8._entries + uVar4;
          bVar10 = true;
          do {
            if ((uVar9 == uVar5) && ((pCVar3->value)._num == local_130._4_4_)) break;
            pCVar3 = pCVar3 + 1;
            if (pCVar3 == local_b8._afterLast) {
              pCVar3 = local_b8._entries;
            }
            uVar9 = pCVar3->code;
            bVar10 = uVar9 != 0;
          } while (bVar10);
        }
        if (bVar10) goto LAB_004a1b74;
        local_d8._capacity._0_4_ = local_130._4_4_;
        ::Lib::Set<Kernel::Variable,Lib::StlHash>::
        rawFindOrInsert<Lib::Set<Kernel::Variable,Lib::StlHash>::insert(Kernel::Variable,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Variable,Lib::StlHash>::insert(Kernel::Variable,unsigned_int)::_lambda(auto:1)_1_>
                  ((Set<Kernel::Variable,Lib::StlHash> *)&local_b8,
                   (anon_class_8_1_ba1d8281)&local_d8,local_130._4_4_,
                   (anon_class_8_1_ba1d8281)&local_d8,(bool *)&local_128);
        local_90._id = local_108->_id;
        local_90._ptr = local_108->_ptr;
        MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomSet
                  ((MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_d8,
                   (Variable)var_00,&local_90);
        ::Lib::
        Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>
        ::operator()((Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>
                      *)this->map,(Variable)var_00,
                     (MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_d8,
                     (MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_d8);
        ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack
                  (&local_d8);
      }
      else {
LAB_004a1b74:
        pMVar7 = (local_58->_factors)._stack;
        local_e8 = local_58;
        pMVar2 = (local_58->_factors)._cursor;
        lVar6 = (long)pMVar2 - (long)pMVar7;
        if (pMVar7 != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0 && lVar6 != 0
           ) {
          local_e0 = (lVar6 >> 2) * 0x6db6db6db6db6db7;
          uVar4 = (ulong)(pMVar2 != pMVar7);
          do {
            _Stack_120._mp_alloc = 0;
            _Stack_120._mp_size = 0;
            _Stack_120._mp_d = (mp_limb_t *)0x0;
            local_128 = (mp_limb_t *)
                        ((ulong)*(byte *)&(pMVar7->term).super_PolyNfSuper._inner.
                                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                          .
                                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                        & 0xffffffffffffff03);
            f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                       *)pMVar7;
            f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                      *)&local_128;
            ::Lib::CoproductImpl::
            RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
            ::
            switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                      ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                        *)&local_128,f);
            local_110 = pMVar7->power;
            if (((byte)local_128._0_1_ & 3) == 1) {
              key._num = local_128._1_4_;
              this_00 = this->map;
              MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>::bot();
              AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>::AnyNumber
                        ((AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)local_4c,
                         (MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_d8);
              ::Lib::
              Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
              ::replaceOrInsert(this_00,key,
                                (AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)
                                local_4c);
              ::Lib::CoproductImpl::
              RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>
              ::
              switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
                        (local_4c,(anon_class_8_1_8991fb9c)local_4c);
              ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack
                        (&local_d8);
            }
            if (uVar4 < local_e0) {
              pMVar7 = (local_e8->_factors)._stack + uVar4;
              uVar4 = uVar4 + 1;
            }
            else {
              pMVar7 = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
            }
          } while (pMVar7 != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0);
        }
      }
      mpz_clear(local_80.super_RationalConstantType._den._val);
      mpz_clear((__mpz_struct *)&local_80);
      if (local_f0 < local_f8) {
        pMVar8 = (local_100->_summands)._stack + local_f0;
        uVar4 = local_f0 + 1;
      }
      else {
        pMVar8 = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
        uVar4 = local_f0;
      }
    } while (pMVar8 != (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0);
  }
  if (local_b8._entries != (Cell *)0x0) {
    uVar4 = (long)local_b8._capacity * 8 + 0xfU & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      (local_b8._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      (local_b8._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_b8._entries;
    }
    else if (uVar4 < 0x11) {
      (local_b8._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      (local_b8._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_b8._entries;
    }
    else if (uVar4 < 0x19) {
      (local_b8._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      (local_b8._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_b8._entries;
    }
    else if (uVar4 < 0x21) {
      (local_b8._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      (local_b8._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_b8._entries;
    }
    else if (uVar4 < 0x31) {
      (local_b8._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      (local_b8._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_b8._entries;
    }
    else if (uVar4 < 0x41) {
      (local_b8._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      (local_b8._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_b8._entries;
    }
    else {
      operator_delete(local_b8._entries,0x10);
    }
  }
  return;
}

Assistant:

void operator()(Perfect<Polynom<NumTraits>> poly)
  {
    // a variable might occur twice within one sum.
    Set<Variable, StlHash> didOccur;
    for (auto monom : poly->iterSummands()) {
      auto var = monom.tryVar();

      if (var.isSome() && !didOccur.contains(var.unwrap())) {
        auto v = var.unwrap();
        didOccur.insert(v);
        auto gen = MonomSet<NumTraits>(v, poly);
        map.updateOrInit(v,
            [&](AnyNumber<MonomSet> old_) 
            { 
              auto old = old_.downcast<NumTraits>().unwrap();
              auto result = std::move(old).intersect(std::move(gen));
              return AnyNumber<MonomSet>(std::move(result));
            },
            [&]() { return AnyNumber<MonomSet>(std::move(gen)); });
      } else {
        for (auto factor : monom.factors->iter()) {
           if (factor.term.template is<Variable>()) {
             auto v = factor.term.template unwrap<Variable>();
             map.replaceOrInsert(v, MonomSet<NumTraits>::bot());
           }
        }
      }

    }
  }